

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMElementNSImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMElementNSImpl::setName
          (DOMElementNSImpl *this,XMLCh *namespaceURI,XMLCh *qualifiedName)

{
  short *psVar1;
  short *psVar2;
  DOMDocument *pDVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLCh *pXVar9;
  long lVar10;
  undefined4 extraout_var_02;
  DOMException *this_00;
  undefined4 extraout_var_03;
  undefined8 *puVar11;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  ulong uVar12;
  XMLSize_t XVar13;
  DOMStringPoolEntry *pDVar14;
  int colon_count;
  XMLCh *pXVar15;
  XMLCh XVar16;
  DOMDocumentImpl *this_01;
  XMLSize_t XVar17;
  DOMStringPoolEntry *pDVar8;
  
  pDVar3 = (this->super_DOMElementImpl).fParent.fOwnerDocument;
  this_01 = (DOMDocumentImpl *)&pDVar3[-1].super_DOMNode;
  if (pDVar3 == (DOMDocument *)0x0) {
    this_01 = (DOMDocumentImpl *)0x0;
  }
  iVar6 = 0;
  if (qualifiedName == (XMLCh *)0x0) {
    pXVar9 = (XMLCh *)0x0;
  }
  else {
    lVar10 = 0;
    do {
      psVar1 = (short *)((long)qualifiedName + lVar10);
      lVar10 = lVar10 + 2;
    } while (*psVar1 != 0);
    uVar7 = (ulong)(ushort)*qualifiedName;
    if (uVar7 == 0) {
      uVar7 = 0;
    }
    else {
      XVar16 = qualifiedName[1];
      if (XVar16 != L'\0') {
        pXVar9 = qualifiedName + 2;
        do {
          uVar7 = (ulong)(ushort)XVar16 + (uVar7 >> 0x18) + uVar7 * 0x26;
          XVar16 = *pXVar9;
          pXVar9 = pXVar9 + 1;
        } while (XVar16 != L'\0');
      }
      uVar7 = uVar7 % this_01->fNameTableSize;
    }
    XVar17 = (lVar10 >> 1) - 1;
    pDVar8 = this_01->fNameTable[uVar7];
    if (pDVar8 == (DOMStringPoolEntry *)0x0) {
      pDVar14 = (DOMStringPoolEntry *)(this_01->fNameTable + uVar7);
    }
    else {
      do {
        pDVar14 = pDVar8;
        if (pDVar14->fLength == XVar17) {
          pXVar9 = pDVar14->fString;
          if (pXVar9 == qualifiedName) goto LAB_00273dff;
          lVar10 = 0;
          do {
            psVar1 = (short *)((long)pXVar9 + lVar10);
            if (*psVar1 == 0) {
              if (*(short *)((long)qualifiedName + lVar10) == 0) goto LAB_00273dff;
              break;
            }
            psVar2 = (short *)((long)qualifiedName + lVar10);
            lVar10 = lVar10 + 2;
          } while (*psVar1 == *psVar2);
        }
        pDVar8 = pDVar14->fNext;
      } while (pDVar14->fNext != (DOMStringPoolEntry *)0x0);
    }
    iVar5 = (*(this_01->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                      (this_01,XVar17 * 2 + 0x18);
    pDVar8 = (DOMStringPoolEntry *)CONCAT44(extraout_var,iVar5);
    pDVar14->fNext = pDVar8;
    pDVar8->fLength = XVar17;
    pDVar8->fNext = (DOMStringPoolEntry *)0x0;
    pXVar9 = pDVar8->fString;
    XMLString::copyString(pXVar9,qualifiedName);
  }
LAB_00273dff:
  (this->super_DOMElementImpl).fName = pXVar9;
  uVar7 = 0xffffffff;
  uVar12 = 0;
  do {
    if (qualifiedName[uVar12] == L':') {
      iVar6 = iVar6 + 1;
      uVar7 = uVar12 & 0xffffffff;
    }
    else if (qualifiedName[uVar12] == L'\0') break;
    uVar12 = uVar12 + 1;
  } while( true );
  iVar5 = (int)uVar7;
  XVar17 = 0xffffffff;
  if (((iVar5 != 0 && (int)uVar12 != 0) && (iVar6 < 2 && (int)uVar12 + -1 != iVar5)) &&
     (XVar17 = 0, iVar5 != -1)) {
    XVar17 = uVar7;
  }
  if ((int)XVar17 < 0) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar6 = (*(this->super_DOMElementImpl).super_DOMElement.super_DOMNode._vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var_04,iVar6) == 0) {
      puVar11 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar6 = (*(this->super_DOMElementImpl).super_DOMElement.super_DOMNode._vptr_DOMNode[0xc])();
      puVar11 = (undefined8 *)(CONCAT44(extraout_var_06,iVar6) + 0x158);
    }
    DOMException::DOMException(this_00,0xe,0,(MemoryManager *)*puVar11);
LAB_00274253:
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  if ((int)XVar17 == 0) {
    this->fPrefix = (XMLCh *)0x0;
    this->fLocalName = pXVar9;
  }
  else {
    if (qualifiedName == (XMLCh *)0x0) {
      pXVar9 = (XMLCh *)0x0;
    }
    else {
      uVar7 = (ulong)(ushort)*qualifiedName;
      XVar13 = 0;
      do {
        uVar7 = (ulong)(ushort)qualifiedName[XVar13 + 1] + (uVar7 >> 0x18) + uVar7 * 0x26;
        XVar13 = XVar13 + 1;
      } while (XVar17 != XVar13);
      uVar7 = uVar7 % this_01->fNameTableSize;
      pDVar8 = this_01->fNameTable[uVar7];
      if (pDVar8 == (DOMStringPoolEntry *)0x0) {
        pDVar14 = (DOMStringPoolEntry *)(this_01->fNameTable + uVar7);
      }
      else {
        do {
          pDVar14 = pDVar8;
          if (pDVar14->fLength == XVar17) {
            pXVar9 = pDVar14->fString;
            if (pXVar9 == qualifiedName) goto LAB_00273f4e;
            XVar13 = 0;
            while ((XVar16 = pXVar9[XVar13], XVar16 != L'\0' && (XVar16 == qualifiedName[XVar13])))
            {
              XVar13 = XVar13 + 1;
              if (XVar17 == XVar13) goto LAB_00273f4e;
            }
            if (XVar16 == qualifiedName[XVar13]) goto LAB_00273f4e;
          }
          pDVar8 = pDVar14->fNext;
        } while (pDVar14->fNext != (DOMStringPoolEntry *)0x0);
      }
      iVar6 = (*(this_01->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                        (this_01,XVar17 * 2 + 0x18);
      pDVar8 = (DOMStringPoolEntry *)CONCAT44(extraout_var_00,iVar6);
      pDVar14->fNext = pDVar8;
      pDVar8->fLength = XVar17;
      pDVar8->fNext = (DOMStringPoolEntry *)0x0;
      pXVar9 = pDVar8->fString;
      XMLString::copyNString(pXVar9,qualifiedName,XVar17);
    }
LAB_00273f4e:
    this->fPrefix = pXVar9;
    pXVar9 = (this->super_DOMElementImpl).fName;
    pXVar15 = pXVar9 + XVar17 + 1;
    lVar10 = 0;
    do {
      psVar1 = (short *)((long)pXVar15 + lVar10);
      lVar10 = lVar10 + 2;
    } while (*psVar1 != 0);
    uVar7 = (ulong)(ushort)*pXVar15;
    if (uVar7 == 0) {
      uVar7 = 0;
    }
    else {
      XVar16 = pXVar9[XVar17 + 2];
      if (XVar16 != L'\0') {
        pXVar9 = pXVar9 + XVar17 + 3;
        do {
          uVar7 = (ulong)(ushort)XVar16 + (uVar7 >> 0x18) + uVar7 * 0x26;
          XVar16 = *pXVar9;
          pXVar9 = pXVar9 + 1;
        } while (XVar16 != L'\0');
      }
      uVar7 = uVar7 % this_01->fNameTableSize;
    }
    XVar17 = (lVar10 >> 1) - 1;
    pDVar8 = this_01->fNameTable[uVar7];
    if (pDVar8 == (DOMStringPoolEntry *)0x0) {
      pDVar14 = (DOMStringPoolEntry *)(this_01->fNameTable + uVar7);
    }
    else {
      do {
        pDVar14 = pDVar8;
        if (pDVar14->fLength == XVar17) {
          pXVar9 = pDVar14->fString;
          if (pXVar9 == pXVar15) goto LAB_00274053;
          lVar10 = 0;
          do {
            psVar1 = (short *)((long)pXVar9 + lVar10);
            if (*psVar1 == 0) {
              if (*(short *)((long)pXVar15 + lVar10) == 0) goto LAB_00274053;
              break;
            }
            psVar2 = (short *)((long)pXVar15 + lVar10);
            lVar10 = lVar10 + 2;
          } while (*psVar1 == *psVar2);
        }
        pDVar8 = pDVar14->fNext;
      } while (pDVar14->fNext != (DOMStringPoolEntry *)0x0);
    }
    iVar6 = (*(this_01->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                      (this_01,XVar17 * 2 + 0x18);
    pDVar8 = (DOMStringPoolEntry *)CONCAT44(extraout_var_01,iVar6);
    pDVar14->fNext = pDVar8;
    pDVar8->fLength = XVar17;
    pDVar8->fNext = (DOMStringPoolEntry *)0x0;
    pXVar9 = pDVar8->fString;
    XMLString::copyString(pXVar9,pXVar15);
LAB_00274053:
    this->fLocalName = pXVar9;
    bVar4 = DOMDocumentImpl::isXMLName(this_01,this->fPrefix);
    if ((!bVar4) || (bVar4 = DOMDocumentImpl::isXMLName(this_01,this->fLocalName), !bVar4)) {
      this_00 = (DOMException *)__cxa_allocate_exception(0x28);
      iVar6 = (*(this->super_DOMElementImpl).super_DOMElement.super_DOMNode._vptr_DOMNode[0xc])
                        (this);
      if (CONCAT44(extraout_var_03,iVar6) == 0) {
        puVar11 = &XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar6 = (*(this->super_DOMElementImpl).super_DOMElement.super_DOMNode._vptr_DOMNode[0xc])();
        puVar11 = (undefined8 *)(CONCAT44(extraout_var_05,iVar6) + 0x158);
      }
      DOMException::DOMException(this_00,0xe,0,(MemoryManager *)*puVar11);
      goto LAB_00274253;
    }
  }
  pXVar9 = (XMLCh *)0x0;
  if ((namespaceURI != (XMLCh *)0x0) && (*namespaceURI != L'\0')) {
    pXVar9 = namespaceURI;
  }
  pXVar9 = DOMNodeImpl::mapPrefix(this->fPrefix,pXVar9,1);
  if (pXVar9 == (XMLCh *)0x0) {
    pXVar15 = (XMLCh *)0x0;
  }
  else {
    lVar10 = 0;
    do {
      psVar1 = (short *)((long)pXVar9 + lVar10);
      lVar10 = lVar10 + 2;
    } while (*psVar1 != 0);
    uVar7 = (ulong)(ushort)*pXVar9;
    if (uVar7 == 0) {
      uVar7 = 0;
    }
    else {
      XVar16 = pXVar9[1];
      if (XVar16 != L'\0') {
        pXVar15 = pXVar9 + 2;
        do {
          uVar7 = (ulong)(ushort)XVar16 + (uVar7 >> 0x18) + uVar7 * 0x26;
          XVar16 = *pXVar15;
          pXVar15 = pXVar15 + 1;
        } while (XVar16 != L'\0');
      }
      uVar7 = uVar7 % this_01->fNameTableSize;
    }
    XVar17 = (lVar10 >> 1) - 1;
    pDVar8 = this_01->fNameTable[uVar7];
    if (pDVar8 == (DOMStringPoolEntry *)0x0) {
      pDVar14 = (DOMStringPoolEntry *)(this_01->fNameTable + uVar7);
    }
    else {
      do {
        pDVar14 = pDVar8;
        if (pDVar14->fLength == XVar17) {
          pXVar15 = pDVar14->fString;
          if (pXVar15 == pXVar9) goto LAB_002741a8;
          lVar10 = 0;
          do {
            psVar1 = (short *)((long)pXVar15 + lVar10);
            if (*psVar1 == 0) {
              if (*(short *)((long)pXVar9 + lVar10) == 0) goto LAB_002741a8;
              break;
            }
            psVar2 = (short *)((long)pXVar9 + lVar10);
            lVar10 = lVar10 + 2;
          } while (*psVar1 == *psVar2);
        }
        pDVar8 = pDVar14->fNext;
      } while (pDVar14->fNext != (DOMStringPoolEntry *)0x0);
    }
    iVar6 = (*(this_01->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                      (this_01,XVar17 * 2 + 0x18);
    pDVar8 = (DOMStringPoolEntry *)CONCAT44(extraout_var_02,iVar6);
    pDVar14->fNext = pDVar8;
    pDVar8->fLength = XVar17;
    pDVar8->fNext = (DOMStringPoolEntry *)0x0;
    pXVar15 = pDVar8->fString;
    XMLString::copyString(pXVar15,pXVar9);
  }
LAB_002741a8:
  this->fNamespaceURI = pXVar15;
  return;
}

Assistant:

void DOMElementNSImpl::setName(const XMLCh *namespaceURI,
                               const XMLCh *qualifiedName)
{
    DOMDocumentImpl* ownerDoc = (DOMDocumentImpl *) fParent.fOwnerDocument;
    this->fName = ownerDoc->getPooledString(qualifiedName);

    int index = DOMDocumentImpl::indexofQualifiedName(qualifiedName);
    if (index < 0)
        throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);

    if (index == 0)
    {
        //qualifiedName contains no ':'
        //
        fPrefix = 0;
        fLocalName = fName;
    }
    else
    {	//0 < index < this->name.length()-1
        //
        fPrefix = ownerDoc->getPooledNString(qualifiedName, index);
        fLocalName = ownerDoc->getPooledString(fName+index+1);

        // Before we carry on, we should check if the prefix or localName are valid XMLName
        if (!ownerDoc->isXMLName(fPrefix) || !ownerDoc->isXMLName(fLocalName))
          throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
    }

    // DOM Level 3: namespace URI is never empty string.
    //
    const XMLCh * URI = DOMNodeImpl::mapPrefix (
      fPrefix,
      (!namespaceURI || !*namespaceURI) ? 0 : namespaceURI,
      DOMNode::ELEMENT_NODE);

    fNamespaceURI = (URI == 0) ? 0 : ownerDoc->getPooledString(URI);
}